

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::change_port_bundle_struct(Generator *top)

{
  undefined1 local_88 [8];
  PortBundleVisitor b_visitor;
  
  b_visitor.super_IRVisitor._8_8_ =
       &b_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
  b_visitor.super_IRVisitor._vptr_IRVisitor._0_4_ = 0;
  b_visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
  b_visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
  b_visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  b_visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
  b_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  b_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
  b_visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
  local_88 = (undefined1  [8])&PTR_visit_root_002ada48;
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&b_visitor.bundle_mapping_;
  b_visitor.bundle_mapping_._M_t._M_impl._0_4_ = 0;
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       b_visitor.bundle_mapping_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  IRVisitor::visit_generator_root((IRVisitor *)local_88,top);
  merge_bundle_mapping
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
              *)&b_visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  PortBundleVisitor::~PortBundleVisitor((PortBundleVisitor *)local_88);
  return;
}

Assistant:

void change_port_bundle_struct(Generator* top) {
    // pass to extract all the bundles
    PortBundleVisitor b_visitor;
    // this cannot be parallelized if we don't use a lock
    b_visitor.visit_generator_root(top);
    merge_bundle_mapping(b_visitor.bundle_mapping());
}